

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::DynamicList::Reader>
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,Reader copyFrom)

{
  OrphanBuilder local_30;
  
  _::OrphanBuilder::copy(&local_30,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)this->capTable);
  (__return_storage_ptr__->schema).elementType.baseType = copyFrom.schema.elementType.baseType;
  (__return_storage_ptr__->schema).elementType.listDepth = copyFrom.schema.elementType.listDepth;
  (__return_storage_ptr__->schema).elementType.isImplicitParam =
       copyFrom.schema.elementType.isImplicitParam;
  (__return_storage_ptr__->schema).elementType.field_3 = copyFrom.schema.elementType.field_3;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 =
       copyFrom.schema.elementType._6_2_;
  (__return_storage_ptr__->schema).elementType.field_4 = copyFrom.schema.elementType.field_4;
  (__return_storage_ptr__->builder).segment = local_30.segment;
  (__return_storage_ptr__->builder).capTable = local_30.capTable;
  (__return_storage_ptr__->builder).location = local_30.location;
  local_30.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_30.tag.content;
  local_30.location = (word *)0x0;
  _::OrphanBuilder::~OrphanBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Orphan<DynamicList> Orphanage::newOrphanCopy<DynamicList::Reader>(
    DynamicList::Reader copyFrom) const {
  return Orphan<DynamicList>(copyFrom.getSchema(),
      _::OrphanBuilder::copy(arena, capTable, copyFrom.reader));
}